

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O1

void __thiscall CChat::OnReset(CChat *this)

{
  CCommandManager *this_00;
  char *pcVar1;
  bool *pbVar2;
  undefined1 auVar3 [16];
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long lVar6;
  
  auVar3 = _DAT_001d6390;
  if ((((this->super_CComponent).m_pClient)->m_pClient->m_State & 0xfffffffbU) == 0) {
    lVar4 = 0;
    do {
      pcVar1 = this->m_aLines[0].m_aName + lVar4 + -0x20;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      pcVar1 = this->m_aLines[0].m_aName + lVar4 + -0x14;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = -0x80;
      pcVar1[3] = -0x41;
      this->m_aLines[0].m_aText[lVar4] = '\0';
      this->m_aLines[0].m_aName[lVar4] = '\0';
      lVar4 = lVar4 + 0x268;
    } while (lVar4 != 0x25990);
    this->m_Mode = 0;
    CLineInput::Deactivate(&this->m_Input);
    this->m_LastWhisperFrom = -1;
    this->m_Show = false;
    this->m_BacklogPage = 0;
    this->m_CompletionChosen = -1;
    this->m_CompletionFav = -1;
    this->m_aCompletionBuffer[0] = '\0';
    this->m_PlaceholderOffset = 0;
    this->m_PlaceholderLength = 0;
    this->m_pHistoryEntry = (CHistoryEntry *)0x0;
    this->m_PendingChatCounter = 0;
    this->m_LastChatSend = 0;
    this->m_IgnoreCommand = false;
    this->m_SelectedCommand = 0;
    this->m_CommandStart = 0;
    if ((this->m_aFilter).list_size < 8) {
      array<bool,_allocator_default<bool>_>::alloc(&this->m_aFilter,8);
    }
    (this->m_aFilter).num_elements = 8;
    pbVar2 = (this->m_aFilter).list;
    pbVar2[0] = false;
    pbVar2[1] = false;
    pbVar2[2] = false;
    pbVar2[3] = false;
    pbVar2[4] = false;
    pbVar2[5] = false;
    pbVar2[6] = false;
    pbVar2[7] = false;
    this->m_FilteredCount = 0;
    this->m_aLastSoundPlayed[0] = 0;
    this->m_aLastSoundPlayed[1] = 0;
    this->m_aLastSoundPlayed[2] = 0;
  }
  else {
    lVar4 = 0x9f4;
    auVar5 = _DAT_001d9d10;
    auVar7 = _DAT_001d6f30;
    do {
      auVar8 = auVar7 ^ auVar3;
      if (auVar8._4_4_ == -0x80000000 && auVar8._0_4_ < -0x7fffff06) {
        *(undefined4 *)((long)this + lVar4 + -0x738) = 0xbf800000;
        *(undefined4 *)((long)this + lVar4 + -0x4d0) = 0xbf800000;
      }
      auVar8 = auVar5 ^ auVar3;
      if (auVar8._4_4_ == -0x80000000 && auVar8._0_4_ < -0x7fffff06) {
        *(undefined4 *)((long)this + lVar4 + -0x268) = 0xbf800000;
        pcVar1 = this->m_aInputBuf + lVar4 + -0x10;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = -0x80;
        pcVar1[3] = -0x41;
      }
      lVar6 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 4;
      auVar7._8_8_ = lVar6 + 4;
      lVar6 = auVar5._8_8_;
      auVar5._0_8_ = auVar5._0_8_ + 4;
      auVar5._8_8_ = lVar6 + 4;
      lVar4 = lVar4 + 0x9a0;
    } while (lVar4 != 0x26854);
  }
  this->m_CurrentLineWidth = -1.0;
  if (2 < ((this->super_CComponent).m_pClient)->m_pClient->m_State) {
    return;
  }
  this_00 = &this->m_CommandManager;
  array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_>::clear
            (&this_00->m_aCommands);
  CCommandManager::AddCommand(this_00,"all","Switch to all chat","?r[message]",Com_All,this);
  CCommandManager::AddCommand(this_00,"friend","Add player as friend","s[name]",Com_Befriend,this);
  CCommandManager::AddCommand(this_00,"m","Mute a player","s[name]",Com_Mute,this);
  CCommandManager::AddCommand(this_00,"mute","Mute a player","s[name]",Com_Mute,this);
  CCommandManager::AddCommand(this_00,"r","Reply to a whisper","?r[message]",Com_Reply,this);
  CCommandManager::AddCommand(this_00,"team","Switch to team chat","?r[message]",Com_Team,this);
  CCommandManager::AddCommand(this_00,"w","Whisper another player","r[name]",Com_Whisper,this);
  CCommandManager::AddCommand(this_00,"whisper","Whisper another player","r[name]",Com_Whisper,this)
  ;
  return;
}

Assistant:

void CChat::OnReset()
{
	if(Client()->State() == IClient::STATE_OFFLINE || Client()->State() == IClient::STATE_DEMOPLAYBACK)
	{
		for(int i = 0; i < MAX_LINES; i++)
		{
			m_aLines[i].m_Time = 0;
			m_aLines[i].m_Size.y = -1.0f;
			m_aLines[i].m_aText[0] = '\0';
			m_aLines[i].m_aName[0] = '\0';
		}

		Disable();
		m_LastWhisperFrom = -1;
		m_Show = false;
		m_BacklogPage = 0;
		m_CompletionChosen = -1;
		m_CompletionFav = -1;
		m_aCompletionBuffer[0] = '\0';
		m_PlaceholderOffset = 0;
		m_PlaceholderLength = 0;
		m_pHistoryEntry = 0x0;
		m_PendingChatCounter = 0;
		m_LastChatSend = 0;

		m_IgnoreCommand = false;
		m_SelectedCommand = 0;
		m_CommandStart = 0;

		m_aFilter.set_size(8); //Should help decrease allocations
		for(int i = 0; i < m_aFilter.size(); i++)
			m_aFilter[i] = false;

		m_FilteredCount = 0;

		for(int i = 0; i < CHAT_NUM; ++i)
			m_aLastSoundPlayed[i] = 0;
	}
	else
	{
		for(int i = 0; i < MAX_LINES; i++)
		{
			m_aLines[i].m_Size.y = -1.0f;
		}
	}

	m_CurrentLineWidth = -1.0f;

	// init chat commands (must be in alphabetical order)
	if(Client()->State() < IClient::STATE_ONLINE)
	{
		m_CommandManager.ClearCommands();
		m_CommandManager.AddCommand("all", "Switch to all chat", "?r[message]", &Com_All, this);
		m_CommandManager.AddCommand("friend", "Add player as friend", "s[name]", &Com_Befriend, this);
		m_CommandManager.AddCommand("m", "Mute a player", "s[name]", &Com_Mute, this);
		m_CommandManager.AddCommand("mute", "Mute a player", "s[name]", &Com_Mute, this);
		m_CommandManager.AddCommand("r", "Reply to a whisper", "?r[message]", &Com_Reply, this);
		m_CommandManager.AddCommand("team", "Switch to team chat", "?r[message]", &Com_Team, this);
		m_CommandManager.AddCommand("w", "Whisper another player", "r[name]", &Com_Whisper, this);
		m_CommandManager.AddCommand("whisper", "Whisper another player", "r[name]", &Com_Whisper, this);
	}
}